

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp)

{
  REF_NODE ref_node;
  REF_NODE ref_node_00;
  REF_MPI ref_mpi_00;
  uint uVar1;
  void *send;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *recept_cell;
  REF_INT *recept_node;
  REF_INT *recept_ret;
  REF_INT *recept_proc;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_bary;
  REF_DBL *donor_log_m;
  REF_DBL *recept_log_m;
  REF_INT n_donor;
  REF_INT donation;
  REF_INT n_recept;
  REF_INT receptor;
  REF_DBL log_parent_m [4] [6];
  REF_INT nodes [27];
  int local_54;
  int local_50;
  REF_INT im;
  REF_INT ibary;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_CELL from_cell;
  REF_NODE from_node;
  REF_NODE to_node;
  REF_GRID from_grid;
  REF_GRID to_grid;
  REF_INTERP ref_interp_local;
  
  ref_node = ref_interp->to_grid->node;
  ref_node_00 = ref_interp->from_grid->node;
  ref_mpi_00 = ref_interp->ref_mpi;
  if (ref_interp->from_grid->twod == 0) {
    ref_mpi = (REF_MPI)ref_interp->from_tet;
  }
  else {
    ref_mpi = (REF_MPI)ref_interp->from_tri;
  }
  n_donor = 0;
  for (im = 0; im < ref_node->max; im = im + 1) {
    if ((((-1 < im) && (im < ref_node->max)) && (-1 < ref_node->global[im])) &&
       (ref_node->ref_mpi->id == ref_node->part[im])) {
      n_donor = n_donor + 1;
    }
  }
  if (n_donor * 4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x263,
           "ref_metric_interpolate","malloc recept_bary of REF_DBL negative");
    ref_interp_local._4_4_ = 1;
  }
  else {
    donor_bary = (REF_DBL *)malloc((long)(n_donor << 2) << 3);
    if (donor_bary == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x263,"ref_metric_interpolate","malloc recept_bary of REF_DBL NULL");
      ref_interp_local._4_4_ = 2;
    }
    else if (n_donor < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x264,"ref_metric_interpolate","malloc recept_cell of REF_INT negative");
      ref_interp_local._4_4_ = 1;
    }
    else {
      send = malloc((long)n_donor << 2);
      if (send == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x264,"ref_metric_interpolate","malloc recept_cell of REF_INT NULL");
        ref_interp_local._4_4_ = 2;
      }
      else if (n_donor < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x265,"ref_metric_interpolate","malloc recept_node of REF_INT negative");
        ref_interp_local._4_4_ = 1;
      }
      else {
        recept_cell = (REF_INT *)malloc((long)n_donor << 2);
        if (recept_cell == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x265,"ref_metric_interpolate","malloc recept_node of REF_INT NULL");
          ref_interp_local._4_4_ = 2;
        }
        else if (n_donor < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x266,"ref_metric_interpolate","malloc recept_ret of REF_INT negative");
          ref_interp_local._4_4_ = 1;
        }
        else {
          recept_node = (REF_INT *)malloc((long)n_donor << 2);
          if (recept_node == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x266,"ref_metric_interpolate","malloc recept_ret of REF_INT NULL");
            ref_interp_local._4_4_ = 2;
          }
          else if (n_donor < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x267,"ref_metric_interpolate","malloc recept_proc of REF_INT negative");
            ref_interp_local._4_4_ = 1;
          }
          else {
            recept_ret = (REF_INT *)malloc((long)n_donor << 2);
            if (recept_ret == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x267,"ref_metric_interpolate","malloc recept_proc of REF_INT NULL");
              ref_interp_local._4_4_ = 2;
            }
            else {
              n_donor = 0;
              for (im = 0; im < ref_node->max; im = im + 1) {
                if (((-1 < im) && (im < ref_node->max)) &&
                   ((-1 < ref_node->global[im] && (ref_node->ref_mpi->id == ref_node->part[im])))) {
                  if (ref_interp->cell[im] == -1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x26c,"ref_metric_interpolate","node needs to be localized");
                    return 1;
                  }
                  uVar1 = ref_node_clip_bary4(ref_interp->bary + (im << 2),
                                              donor_bary + (n_donor << 2));
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x26f,"ref_metric_interpolate",(ulong)uVar1,"clip");
                    return uVar1;
                  }
                  recept_ret[n_donor] = ref_interp->part[im];
                  *(REF_INT *)((long)send + (long)n_donor * 4) = ref_interp->cell[im];
                  recept_cell[n_donor] = im;
                  recept_node[n_donor] = ref_mpi_00->id;
                  n_donor = n_donor + 1;
                }
              }
              ref_interp_local._4_4_ =
                   ref_mpi_blindsend(ref_mpi_00,recept_ret,send,1,n_donor,&recept_proc,
                                     (REF_INT *)&recept_log_m,1);
              if (ref_interp_local._4_4_ == 0) {
                ref_interp_local._4_4_ =
                     ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_node,1,n_donor,&donor_cell,
                                       (REF_INT *)&recept_log_m,1);
                if (ref_interp_local._4_4_ == 0) {
                  ref_interp_local._4_4_ =
                       ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_cell,1,n_donor,&donor_ret,
                                         (REF_INT *)&recept_log_m,1);
                  if (ref_interp_local._4_4_ == 0) {
                    ref_interp_local._4_4_ =
                         ref_mpi_blindsend(ref_mpi_00,recept_ret,donor_bary,4,n_donor,&donor_node,
                                           (REF_INT *)&recept_log_m,3);
                    if (ref_interp_local._4_4_ == 0) {
                      if (recept_ret != (REF_INT *)0x0) {
                        free(recept_ret);
                      }
                      if (recept_node != (REF_INT *)0x0) {
                        free(recept_node);
                      }
                      if (recept_cell != (REF_INT *)0x0) {
                        free(recept_cell);
                      }
                      if (send != (void *)0x0) {
                        free(send);
                      }
                      if (donor_bary != (REF_DBL *)0x0) {
                        free(donor_bary);
                      }
                      if ((int)recept_log_m * 6 < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x28b,"ref_metric_interpolate",
                               "malloc donor_log_m of REF_DBL negative");
                        ref_interp_local._4_4_ = 1;
                      }
                      else {
                        recept_bary = (REF_DBL *)malloc((long)((int)recept_log_m * 6) << 3);
                        if (recept_bary == (REF_DBL *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0x28b,"ref_metric_interpolate",
                                 "malloc donor_log_m of REF_DBL NULL");
                          ref_interp_local._4_4_ = 2;
                        }
                        else {
                          for (recept_log_m._4_4_ = 0; recept_log_m._4_4_ < (int)recept_log_m;
                              recept_log_m._4_4_ = recept_log_m._4_4_ + 1) {
                            uVar1 = ref_cell_nodes((REF_CELL)ref_mpi,recept_proc[recept_log_m._4_4_]
                                                   ,(REF_INT *)(log_parent_m[3] + 5));
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0x28f,"ref_metric_interpolate",(ulong)uVar1,
                                     "node needs to be localized");
                              return uVar1;
                            }
                            for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
                              uVar1 = ref_node_metric_get_log
                                                (ref_node_00,nodes[(long)local_50 + -2],
                                                 (REF_DBL *)(&n_recept + (long)local_50 * 0xc));
                              if (uVar1 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                       ,0x292,"ref_metric_interpolate",(ulong)uVar1,"log(parentM)");
                                return uVar1;
                              }
                            }
                            for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
                              recept_bary[local_54 + recept_log_m._4_4_ * 6] = 0.0;
                              for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
                                iVar2 = local_54 + recept_log_m._4_4_ * 6;
                                recept_bary[iVar2] =
                                     *(double *)
                                      (donor_node + (long)(local_50 + recept_log_m._4_4_ * 4) * 2) *
                                     *(double *)
                                      (&n_recept + (long)local_50 * 0xc + (long)local_54 * 2) +
                                     recept_bary[iVar2];
                              }
                            }
                          }
                          if (recept_proc != (REF_INT *)0x0) {
                            free(recept_proc);
                          }
                          if (donor_node != (REF_INT *)0x0) {
                            free(donor_node);
                          }
                          ref_interp_local._4_4_ =
                               ref_mpi_blindsend(ref_mpi_00,donor_cell,recept_bary,6,
                                                 (int)recept_log_m,&donor_log_m,&n_donor,3);
                          if (ref_interp_local._4_4_ == 0) {
                            ref_interp_local._4_4_ =
                                 ref_mpi_blindsend(ref_mpi_00,donor_cell,donor_ret,1,
                                                   (int)recept_log_m,&recept_cell,&n_donor,1);
                            if (ref_interp_local._4_4_ == 0) {
                              if (recept_bary != (REF_DBL *)0x0) {
                                free(recept_bary);
                              }
                              if (donor_ret != (REF_INT *)0x0) {
                                free(donor_ret);
                              }
                              if (donor_cell != (REF_INT *)0x0) {
                                free(donor_cell);
                              }
                              for (donation = 0; donation < n_donor; donation = donation + 1) {
                                uVar1 = ref_node_metric_set_log
                                                  (ref_node,recept_cell[donation],
                                                   donor_log_m + donation * 6);
                                if (uVar1 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                         ,0x2ab,"ref_metric_interpolate",(ulong)uVar1,
                                         "set received log met");
                                  return uVar1;
                                }
                              }
                              if (recept_cell != (REF_INT *)0x0) {
                                free(recept_cell);
                              }
                              if (donor_log_m != (REF_DBL *)0x0) {
                                free(donor_log_m);
                              }
                              ref_interp_local._4_4_ = 0;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0x2a3,"ref_metric_interpolate",(ulong)ref_interp_local._4_4_,
                                     "blind send node");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0x2a0,"ref_metric_interpolate",(ulong)ref_interp_local._4_4_,
                                   "blind send bary");
                          }
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x283,"ref_metric_interpolate",(ulong)ref_interp_local._4_4_,
                             "blind send bary");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x280,"ref_metric_interpolate",(ulong)ref_interp_local._4_4_,
                           "blind send node");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x27d,"ref_metric_interpolate",(ulong)ref_interp_local._4_4_,
                         "blind send ret");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x27a,"ref_metric_interpolate",(ulong)ref_interp_local._4_4_,
                       "blind send cell");
              }
            }
          }
        }
      }
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate(REF_INTERP ref_interp) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_INT node, ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL log_parent_m[4][6];
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_log_m, *donor_log_m, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");
      RSS(ref_node_clip_bary4(&(ref_interp->bary[4 * node]),
                              &(recept_bary[4 * n_recept])),
          "clip");
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_log_m, 6 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (ibary = 0; ibary < 4; ibary++)
      RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
          "log(parentM)");
    for (im = 0; im < 6; im++) {
      donor_log_m[im + 6 * donation] = 0.0;
      for (ibary = 0; ibary < 4; ibary++) {
        donor_log_m[im + 6 * donation] +=
            donor_bary[ibary + 4 * donation] * log_parent_m[ibary][im];
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_log_m, 6, n_donor,
                        (void **)(&recept_log_m), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_log_m);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    RSS(ref_node_metric_set_log(to_node, node, &(recept_log_m[6 * receptor])),
        "set received log met");
  }

  ref_free(recept_node);
  ref_free(recept_log_m);

  return REF_SUCCESS;
}